

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O0

Class objc_allocateClassPair(Class superclass,char *name,size_t extraBytes)

{
  id poVar1;
  Class poVar2;
  char *pcVar3;
  Class metaClass;
  Class newClass;
  size_t extraBytes_local;
  char *name_local;
  Class superclass_local;
  
  poVar1 = objc_lookUpClass(name);
  if (poVar1 == (id)0x0) {
    superclass_local = (Class)(*gc->malloc)(extraBytes + 0x88);
    if (superclass_local == (Class)0x0) {
      superclass_local = (Class)0x0;
    }
    else {
      poVar2 = (Class)(*gc->malloc)(0x88);
      if (superclass == (Class)0x0) {
        poVar2->isa = poVar2;
        poVar2->super_class = superclass_local;
      }
      else {
        poVar2->isa = superclass->isa;
        poVar2->super_class = superclass->isa;
      }
      pcVar3 = strdup(name);
      poVar2->name = pcVar3;
      poVar2->info = 0x401;
      poVar2->dtable = uninstalled_dtable;
      poVar2->instance_size = 0x88;
      superclass_local->isa = poVar2;
      superclass_local->super_class = superclass;
      pcVar3 = strdup(name);
      superclass_local->name = pcVar3;
      superclass_local->info = 0x400;
      superclass_local->dtable = uninstalled_dtable;
      superclass_local->abi_version = 2;
      poVar2->abi_version = 2;
      if (superclass == (Class)0x0) {
        superclass_local->instance_size = 8;
      }
      else {
        superclass_local->instance_size = superclass->instance_size;
      }
    }
  }
  else {
    superclass_local = (Class)0x0;
  }
  return superclass_local;
}

Assistant:

Class objc_allocateClassPair(Class superclass, const char *name, size_t extraBytes)
{
	// Check the class doesn't already exist.
	if (nil != objc_lookUpClass(name)) { return Nil; }

	Class newClass = gc->malloc(sizeof(struct objc_class) + extraBytes);

	if (Nil == newClass) { return Nil; }

	// Create the metaclass
	Class metaClass = gc->malloc(sizeof(struct objc_class));

	if (Nil == superclass)
	{
		/*
		 * Metaclasses of root classes are precious little flowers and work a
		 * little differently:
		 */
		metaClass->isa = metaClass;
		metaClass->super_class = newClass;
	}
	else
	{
		// Initialize the metaclass
		// Set the meta-metaclass pointer to the name.  The runtime will fix this
		// in objc_resolve_class().
		// If the superclass is not yet resolved, then we need to look it up
		// via the class table.
		metaClass->isa = superclass->isa;
		metaClass->super_class = superclass->isa;
	}
	metaClass->name = strdup(name);
	metaClass->info = objc_class_flag_meta | objc_class_flag_user_created;
	metaClass->dtable = uninstalled_dtable;
	metaClass->instance_size = sizeof(struct objc_class);

	// Set up the new class
	newClass->isa = metaClass;
	newClass->super_class = superclass;

	newClass->name = strdup(name);
	newClass->info = objc_class_flag_user_created;
	newClass->dtable = uninstalled_dtable;

	newClass->abi_version = 2;
	metaClass->abi_version = 2;

	if (Nil == superclass)
	{
		newClass->instance_size = sizeof(struct objc_class*);
	}
	else
	{
		newClass->instance_size = superclass->instance_size;
	}

	return newClass;
}